

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O0

PropStatus __thiscall
spvtools::opt::CCPPass::VisitInstruction(CCPPass *this,Instruction *instr,BasicBlock **dest_bb)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  BasicBlock **dest_bb_local;
  Instruction *instr_local;
  CCPPass *this_local;
  
  *dest_bb = (BasicBlock *)0x0;
  OVar2 = opt::Instruction::opcode(instr);
  if (OVar2 == OpPhi) {
    this_local._4_4_ = VisitPhi(this,instr);
  }
  else {
    bVar1 = opt::Instruction::IsBranch(instr);
    if (bVar1) {
      this_local._4_4_ = VisitBranch(this,instr,dest_bb);
    }
    else {
      uVar3 = opt::Instruction::result_id(instr);
      if (uVar3 == 0) {
        this_local._4_4_ = kVarying;
      }
      else {
        this_local._4_4_ = VisitAssignment(this,instr);
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

SSAPropagator::PropStatus CCPPass::VisitInstruction(Instruction* instr,
                                                    BasicBlock** dest_bb) {
  *dest_bb = nullptr;
  if (instr->opcode() == spv::Op::OpPhi) {
    return VisitPhi(instr);
  } else if (instr->IsBranch()) {
    return VisitBranch(instr, dest_bb);
  } else if (instr->result_id()) {
    return VisitAssignment(instr);
  }
  return SSAPropagator::kVarying;
}